

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall CPP::WriteInitialization::Item::addChild(Item *this,Item *child)

{
  parameter_type pIVar1;
  parameter_type in_RSI;
  parameter_type in_RDI;
  Item *p;
  Item *c;
  QList<CPP::WriteInitialization::Item_*> *in_stack_ffffffffffffffe0;
  parameter_type this_00;
  parameter_type local_18;
  
  QList<CPP::WriteInitialization::Item_*>::operator<<(in_stack_ffffffffffffffe0,in_RDI);
  in_RSI->m_parent = in_RDI;
  pIVar1 = in_RDI;
  local_18 = in_RSI;
  while (this_00 = pIVar1, this_00 != (parameter_type)0x0) {
    QSet<QString>::operator|=((QSet<QString> *)this_00,(QSet<QString> *)in_RDI);
    QSet<QString>::operator|=((QSet<QString> *)this_00,(QSet<QString> *)in_RDI);
    if ((int)(this_00->m_setupUiData).policy < (int)(local_18->m_setupUiData).policy) {
      (this_00->m_setupUiData).policy = (local_18->m_setupUiData).policy;
    }
    if ((int)(this_00->m_retranslateUiData).policy < (int)(local_18->m_retranslateUiData).policy) {
      (this_00->m_retranslateUiData).policy = (local_18->m_retranslateUiData).policy;
    }
    local_18 = this_00;
    pIVar1 = this_00->m_parent;
  }
  return;
}

Assistant:

void WriteInitialization::Item::addChild(Item *child)
{
    m_children << child;
    child->m_parent = this;

    Item *c = child;
    Item *p = this;
    while (p) {
        p->m_setupUiData.directives |= c->m_setupUiData.directives;
        p->m_retranslateUiData.directives |= c->m_retranslateUiData.directives;
        if (p->m_setupUiData.policy < c->m_setupUiData.policy)
            p->m_setupUiData.policy = c->m_setupUiData.policy;
        if (p->m_retranslateUiData.policy < c->m_retranslateUiData.policy)
            p->m_retranslateUiData.policy = c->m_retranslateUiData.policy;
        c = p;
        p = p->m_parent;
    }
}